

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_signature_normalize
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sigout,
              secp256k1_ecdsa_signature *sigin)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  secp256k1_scalar s;
  secp256k1_scalar local_38;
  
  if (sigin == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_signature_normalize_cold_1();
    uVar6 = 0;
  }
  else {
    local_38.d[0] = *(uint64_t *)(sigin->data + 0x20);
    local_38.d[1] = *(uint64_t *)(sigin->data + 0x28);
    local_38.d[2] = *(uint64_t *)(sigin->data + 0x30);
    local_38.d[3] = *(uint64_t *)(sigin->data + 0x38);
    uVar4 = (uint)(local_38.d[3] >> 0x3f);
    uVar5 = uVar4 ^ 1;
    uVar6 = uVar5;
    if (local_38.d[2] == 0xffffffffffffffff) {
      uVar6 = 0;
    }
    if (0x5d576e7357a4501c < local_38.d[1]) {
      uVar5 = 0;
    }
    uVar5 = (uVar5 | uVar6 | local_38.d[3] < 0x7fffffffffffffff) ^ 1;
    uVar6 = 0;
    if (0xdfe92f46681b20a0 < local_38.d[0]) {
      uVar6 = uVar5;
    }
    if (0x5d576e7357a4501d < local_38.d[1]) {
      uVar6 = uVar5;
    }
    uVar6 = uVar6 | uVar4;
    if (sigout != (secp256k1_ecdsa_signature *)0x0) {
      if (uVar6 != 0) {
        secp256k1_scalar_negate(&local_38,&local_38);
      }
      uVar1 = *(undefined8 *)sigin->data;
      uVar2 = *(undefined8 *)(sigin->data + 8);
      uVar3 = *(undefined8 *)(sigin->data + 0x18);
      *(undefined8 *)(sigout->data + 0x10) = *(undefined8 *)(sigin->data + 0x10);
      *(undefined8 *)(sigout->data + 0x18) = uVar3;
      *(undefined8 *)sigout->data = uVar1;
      *(undefined8 *)(sigout->data + 8) = uVar2;
      *(uint64_t *)(sigout->data + 0x20) = local_38.d[0];
      *(uint64_t *)(sigout->data + 0x28) = local_38.d[1];
      *(uint64_t *)(sigout->data + 0x30) = local_38.d[2];
      *(uint64_t *)(sigout->data + 0x38) = local_38.d[3];
    }
  }
  return uVar6;
}

Assistant:

int secp256k1_ecdsa_signature_normalize(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sigout, const secp256k1_ecdsa_signature *sigin) {
    secp256k1_scalar r, s;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sigin);
    ret = secp256k1_scalar_is_high(&s);
    if (sigout != NULL) {
        if (ret) {
            secp256k1_scalar_negate(&s, &s);
        }
        secp256k1_ecdsa_signature_save(sigout, &r, &s);
    }

    return ret;
}